

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

int __thiscall NALUnit::deserialize(NALUnit *this,uint8_t *buffer,uint8_t *end)

{
  uint8_t *end_local;
  uint8_t *buffer_local;
  NALUnit *this_local;
  
  if (end == buffer) {
    this_local._4_4_ = -10;
  }
  else {
    this->nal_ref_idc = (int)(uint)*buffer >> 5 & 3;
    this->nal_unit_type = *buffer & (nuDummy|nuSliceNonIDR);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int NALUnit::deserialize(uint8_t* buffer, uint8_t* end)
{
    if (end == buffer)
        return NOT_ENOUGH_BUFFER;

    // assert((*buffer & 0x80) == 0);
    if ((*buffer & 0x80) != 0)
    {
        LTRACE(LT_WARN, 0, "Invalid forbidden_zero_bit for nal unit " << (*buffer & 0x1f));
    }

    nal_ref_idc = (*buffer >> 5) & 0x3;
    nal_unit_type = static_cast<NALType>(*buffer & 0x1f);
    return 0;
}